

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

uint32_t helper_clcl(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t ptr;
  bool bVar13;
  uintptr_t unaff_retaddr;
  uint64_t *local_60;
  uint64_t *local_58;
  
  uVar3 = r1 + 1;
  uVar7 = (ulong)((uint)env->regs[uVar3] & 0xffffff);
  lVar6 = (long)(int)r1;
  ptr = env->regs[lVar6];
  uVar12 = (env->psw).mask;
  if ((uVar12 >> 0x20 & 1) == 0) {
    iVar4 = (int)uVar12;
    uVar10 = 0x7fffffff;
    if (-1 < iVar4) {
      uVar10 = 0xffffff;
    }
    ptr = (uint64_t)((uint)ptr & uVar10);
    local_58 = env->regs + (r2 + 1);
    uVar10 = (uint)*local_58;
    local_60 = env->regs + (int)r2;
    if (iVar4 < 0) {
      uVar12 = (ulong)((uint)*local_60 & 0x7fffffff);
    }
    else {
      uVar12 = (ulong)((uint)*local_60 & 0xffffff);
    }
  }
  else {
    local_58 = env->regs + (r2 + 1);
    uVar10 = (uint)*local_58;
    local_60 = env->regs + (int)r2;
    uVar12 = *local_60;
  }
  uVar8 = (ulong)(uVar10 & 0xffffff);
  uVar11 = uVar8;
  if (uVar8 < uVar7) {
    uVar11 = uVar7;
  }
  if (uVar11 == 0) {
    uVar5 = 0;
  }
  else {
    do {
      bVar1 = (byte)(uVar10 >> 0x18);
      uVar9 = (ushort)bVar1;
      if (uVar7 != 0) {
        uVar5 = cpu_ldub_data_ra_s390x(env,ptr,unaff_retaddr);
        uVar9 = (ushort)uVar5;
      }
      uVar2 = (ushort)bVar1;
      if (uVar8 != 0) {
        uVar5 = cpu_ldub_data_ra_s390x(env,uVar12,unaff_retaddr);
        uVar2 = (ushort)uVar5;
      }
      if (uVar9 != uVar2) {
        uVar5 = 2 - (uVar9 < uVar2);
        break;
      }
      uVar5 = 0;
      bVar13 = uVar7 == 0;
      uVar7 = uVar7 - 1;
      if (bVar13) {
        uVar7 = 0;
      }
      ptr = (ptr + 1) - (ulong)bVar13;
      bVar13 = uVar8 == 0;
      uVar8 = uVar8 - 1;
      if (bVar13) {
        uVar8 = 0;
      }
      uVar12 = (uVar12 + 1) - (ulong)bVar13;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  env->regs[uVar3] = uVar7 & 0xffffff | env->regs[uVar3] & 0xffffffffff000000;
  *local_58 = uVar8 & 0xffffff | *local_58 & 0xffffffffff000000;
  uVar7 = (env->psw).mask;
  if ((uVar7 & 0x100000000) == 0) {
    if ((int)uVar7 < 0) {
      uVar3 = (uint)ptr & 0x7fffffff;
      uVar7 = (ulong)*(uint *)((long)env->regs + lVar6 * 8 + 4) << 0x20;
    }
    else {
      uVar7 = env->regs[lVar6] & 0xffffffffff000000;
      uVar3 = (uint)ptr & 0xffffff;
    }
    ptr = uVar3 | uVar7;
  }
  env->regs[lVar6] = ptr;
  uVar7 = (env->psw).mask;
  if ((uVar7 & 0x100000000) == 0) {
    if ((int)uVar7 < 0) {
      uVar3 = (uint)uVar12 & 0x7fffffff;
      uVar7 = (ulong)*(uint *)((long)local_60 + 4) << 0x20;
    }
    else {
      uVar7 = *local_60 & 0xffffffffff000000;
      uVar3 = (uint)uVar12 & 0xffffff;
    }
    uVar12 = uVar3 | uVar7;
  }
  *local_60 = uVar12;
  return uVar5;
}

Assistant:

uint32_t HELPER(clcl)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    uintptr_t ra = GETPC();
    uint64_t src1len = extract64(env->regs[r1 + 1], 0, 24);
    uint64_t src1 = get_address(env, r1);
    uint64_t src3len = extract64(env->regs[r2 + 1], 0, 24);
    uint64_t src3 = get_address(env, r2);
    uint8_t pad = env->regs[r2 + 1] >> 24;
    uint32_t cc;

    cc = do_clcl(env, &src1, &src1len, &src3, &src3len, pad, -1, 1, ra);

    env->regs[r1 + 1] = deposit64(env->regs[r1 + 1], 0, 24, src1len);
    env->regs[r2 + 1] = deposit64(env->regs[r2 + 1], 0, 24, src3len);
    set_address(env, r1, src1);
    set_address(env, r2, src3);

    return cc;
}